

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

hrgls_Status __thiscall hrgls::API::SetLogMessageStreamingState(API *this,bool running)

{
  API_private *pAVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  key_type local_30;
  key_type local_28;
  undefined1 local_19;
  API *pAStack_18;
  bool running_local;
  API *this_local;
  
  if (this->m_private == (API_private *)0x0) {
    this_local._4_4_ = 0x3ee;
  }
  else {
    local_19 = running;
    pAStack_18 = this;
    mVar2 = hrgls_APISetLogMessageStreamingState(this->m_private->m_api,running);
    pAVar1 = this->m_private;
    local_28._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_28);
    *pmVar3 = mVar2;
    pAVar1 = this->m_private;
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_30);
    this_local._4_4_ = *pmVar3;
  }
  return this_local._4_4_;
}

Assistant:

hrgls_Status API::SetLogMessageStreamingState(bool running)
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    m_private->m_status[std::this_thread::get_id()] = hrgls_APISetLogMessageStreamingState(m_private->m_api,
      running);
    return m_private->m_status[std::this_thread::get_id()];
  }